

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O0

bool __thiscall ipx::Iterate::term_crit_reached(Iterate *this)

{
  double dVar1;
  bool bVar2;
  Iterate *in_RDI;
  double dVar3;
  double dres;
  double pres;
  double *in_stack_000000b0;
  double *in_stack_000000b8;
  Iterate *in_stack_000000c0;
  Iterate *in_stack_ffffffffffffffe0;
  double local_18;
  Iterate *this_00;
  
  this_00 = in_RDI;
  bVar2 = feasible(in_stack_ffffffffffffffe0);
  if ((bVar2) && (bVar2 = optimal(this_00), bVar2)) {
    if (in_RDI->start_crossover_tol_ <= 0.0) {
      return true;
    }
    ResidualsFromDropping(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
    dVar1 = in_RDI->start_crossover_tol_;
    dVar3 = Model::norm_bounds(in_RDI->model_);
    if ((local_18 <= dVar1 * (dVar3 + 1.0)) &&
       (dVar1 = in_RDI->start_crossover_tol_, dVar3 = Model::norm_c(in_RDI->model_),
       (double)in_stack_ffffffffffffffe0 <= dVar1 * (dVar3 + 1.0))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Iterate::term_crit_reached() const {
    if (feasible() && optimal()) {
        if (start_crossover_tol_ <= 0.0)
            return true;
        double pres, dres;
        ResidualsFromDropping(&pres, &dres);
        if (pres <= start_crossover_tol_ * (1.0+model_.norm_bounds()) &&
            dres <= start_crossover_tol_ * (1.0+model_.norm_c()))
            return true;
    }
    return false;
}